

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
Tree::BuildUnitImpl(Tree *this,cmXMLWriter *xml,string *virtualFolderPath,string *fsPath)

{
  Tree *pTVar1;
  _Base_ptr p_Var2;
  Tree *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (p_Var2 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->files)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Unit",(allocator<char> *)&local_90);
    cmXMLWriter::StartElement(xml,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator+(&local_70,fsPath,&this->path);
    std::operator+(&local_90,&local_70,"/");
    std::operator+(&local_b0,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1)
                  );
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Option",(allocator<char> *)&local_90);
    cmXMLWriter::StartElement(xml,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator+(&local_70,"CMake Files\\",virtualFolderPath);
    std::operator+(&local_90,&local_70,&this->path);
    std::operator+(&local_b0,&local_90,"\\");
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"virtualFolder",&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    cmXMLWriter::EndElement(xml);
    cmXMLWriter::EndElement(xml);
  }
  pTVar1 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1) {
    std::operator+(&local_90,virtualFolderPath,&this->path);
    std::operator+(&local_b0,&local_90,"\\");
    std::operator+(&local_50,fsPath,&this->path);
    std::operator+(&local_70,&local_50,"/");
    BuildUnitImpl(this_00,xml,&local_b0,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void Tree::BuildUnitImpl(cmXMLWriter& xml,
                         const std::string& virtualFolderPath,
                         const std::string& fsPath) const
{
  for (std::string const& f : files) {
    xml.StartElement("Unit");
    xml.Attribute("filename", fsPath + path + "/" + f);

    xml.StartElement("Option");
    xml.Attribute("virtualFolder",
                  "CMake Files\\" + virtualFolderPath + path + "\\");
    xml.EndElement();

    xml.EndElement();
  }
  for (Tree const& folder : folders) {
    folder.BuildUnitImpl(xml, virtualFolderPath + path + "\\",
                         fsPath + path + "/");
  }
}